

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatTypeSCP.cpp
# Opt level: O2

int __thiscall
FormatTypeSCP::LoadDisk
          (FormatTypeSCP *this,uchar *buffer,size_t size,IDisk **created_disk,
          ILoadingProgress *loading_progress)

{
  FormatTypeSCP *pFVar1;
  uchar *__s1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  IDisk *this_00;
  MFMTrack *pMVar8;
  long lVar9;
  ulong *puVar10;
  uchar *bitfield;
  undefined8 *puVar11;
  void *__s;
  byte bVar12;
  ulong uVar13;
  FormatTypeSCP *this_01;
  int duration;
  long lVar14;
  ulong uVar15;
  int side;
  Revolution *pRVar16;
  MFMTrack **ppMVar17;
  bool bVar18;
  
  duration = (int)loading_progress;
  iVar5 = bcmp(buffer,"SCP",3);
  iVar6 = -1;
  if (iVar5 == 0) {
    this_00 = (IDisk *)operator_new(0x68);
    IDisk::IDisk(this_00);
    bVar2 = buffer[5];
    uVar15 = (ulong)bVar2;
    bVar3 = buffer[7];
    bVar18 = 0x2a < bVar3;
    this_00->nb_sides_ = bVar18 + '\x01';
    uVar7 = (bVar3 >> bVar18) + 1;
    uVar13 = (ulong)(uVar7 * 0x20);
    for (lVar14 = 0; lVar14 != (ulong)bVar18 + 1; lVar14 = lVar14 + 1) {
      this_00->side_[lVar14].nb_tracks = uVar7;
      pMVar8 = (MFMTrack *)operator_new__(uVar13);
      this_00->side_[lVar14].tracks = pMVar8;
      memset(pMVar8,0,uVar13);
      for (lVar9 = 0; (ulong)(bVar3 >> bVar18) * 0x20 + 0x20 != lVar9; lVar9 = lVar9 + 0x20) {
        *(undefined4 *)((long)&pMVar8->nb_revolutions + lVar9) = 1;
      }
    }
    pFVar1 = (FormatTypeSCP *)(uVar15 * 0x30 + 8);
    for (lVar14 = 0; lVar14 != 0xa6; lVar14 = lVar14 + 1) {
      uVar13 = (ulong)*(uint *)(buffer + lVar14 * 4 + 0x10);
      this->tracks_header_[lVar14].offset = *(uint *)(buffer + lVar14 * 4 + 0x10);
      if (uVar13 != 0) {
        __s1 = buffer + uVar13;
        iVar6 = bcmp(__s1,"TRK",3);
        if (iVar6 != 0) {
          return -3;
        }
        bVar4 = 0x2a < bVar3 & __s1[3];
        bVar12 = __s1[3] >> (0x2a < bVar3);
        if (this_00->side_[bVar4].nb_tracks <= (uint)bVar12) {
          return -1;
        }
        pMVar8 = this_00->side_[bVar4].tracks;
        pMVar8[bVar12].nb_revolutions = (uint)bVar2;
        this_01 = pFVar1;
        puVar10 = (ulong *)operator_new__((ulong)pFVar1);
        *puVar10 = uVar15;
        if (bVar2 != 0) {
          lVar9 = 0;
          do {
            *(undefined8 *)((long)puVar10 + lVar9 + 0x28) = 0;
            puVar11 = (undefined8 *)((long)puVar10 + lVar9 + 0x18);
            *puVar11 = 0;
            puVar11[1] = 0;
            lVar9 = lVar9 + 0x30;
          } while (uVar15 * 0x30 != lVar9);
        }
        pRVar16 = (Revolution *)(puVar10 + 1);
        pMVar8[bVar12].revolution = pRVar16;
        for (lVar9 = 0; uVar15 * 0xc != lVar9; lVar9 = lVar9 + 0xc) {
          iVar6 = *(int *)(buffer + lVar9 + uVar13 + 8);
          iVar5 = *(int *)(buffer + lVar9 + uVar13 + 0xc);
          this->rpm_correction_ = (double)(*(int *)(buffer + lVar9 + uVar13 + 4) / 40000) / 200.0;
          uVar7 = ComputeTrack(this_01,(uchar *)0x0,__s1 + iVar5,iVar6,duration);
          (&pRVar16->size)[lVar9] = uVar7;
          this_01 = (FormatTypeSCP *)(ulong)uVar7;
          bitfield = (uchar *)operator_new__((ulong)this_01);
          *(uchar **)((long)&(pMVar8[bVar12].revolution)->bitfield + lVar9 * 4) = bitfield;
          uVar7 = ComputeTrack(this_01,bitfield,__s1 + iVar5,iVar6,duration);
          pRVar16 = pMVar8[bVar12].revolution;
          (&pRVar16->size)[lVar9] = uVar7;
        }
      }
    }
    for (lVar14 = 0; lVar14 != (ulong)bVar18 + 1; lVar14 = lVar14 + 1) {
      ppMVar17 = &this_00->side_[lVar14].tracks;
      lVar9 = 0;
      for (uVar15 = 0; (uVar15 != 0x2b && (uVar15 < *(uint *)(ppMVar17 + 1))); uVar15 = uVar15 + 1)
      {
        pMVar8 = *ppMVar17;
        if (*(long *)((long)&pMVar8->revolution + lVar9) == 0) {
          *(undefined4 *)((long)&pMVar8->nb_revolutions + lVar9) = 1;
          puVar11 = (undefined8 *)operator_new__(0x38);
          *puVar11 = 1;
          puVar11[5] = 0;
          puVar11[3] = 0;
          puVar11[4] = 0;
          *(undefined8 **)((long)&pMVar8->revolution + lVar9) = puVar11 + 1;
          __s = operator_new__(100000);
          puVar11 = *(undefined8 **)((long)&pMVar8->revolution + lVar9);
          *puVar11 = __s;
          *(undefined4 *)(puVar11 + 1) = 100000;
          memset(__s,0,100000);
        }
        lVar9 = lVar9 + 0x20;
      }
    }
    *created_disk = this_00;
    (*this_00->_vptr_IDisk[0x14])();
    iVar6 = 0;
  }
  return iVar6;
}

Assistant:

int FormatTypeSCP::LoadDisk(const unsigned char* buffer, size_t size, IDisk*& created_disk,
                            ILoadingProgress* loading_progress)
{
   unsigned char version, diskType, numRevolution;
   unsigned char startTrack, endTrack, flags;
   unsigned int check_sum_computed = 0;
   const unsigned char* header = buffer;

   if (memcmp(header, "SCP", 3) == 0)
   {
      IDisk* new_disk = new IDisk();

      version = header[3];
      diskType = header[4];
      numRevolution = header[5];
      startTrack = header[6];
      endTrack = header[7];
      flags = header[8];
      unsigned char width = header[9];
      unsigned char nb_heads = header[0x0A];
      unsigned int checkSum = *((unsigned int*)(&header[0x0C]));

      // Check the checksum !
      for (unsigned int crc = 0x10; crc < size; crc++)
      {
         check_sum_computed += header[crc];
      }
      // Compare :
      if (check_sum_computed != checkSum)
      {
         // Something to do ?
         int dbg = 1;
      }


      // Number of side :
      new_disk->nb_sides_ = (endTrack > 42) ? 2 : 1;
      int nbtracks = ((new_disk->nb_sides_ == 1) ? (endTrack) : (endTrack) / 2) + 1;
      for (int side = 0; side < new_disk->nb_sides_; side++)
      {
         new_disk->side_[side].nb_tracks = nbtracks;
         new_disk->side_[side].tracks = new IDisk::MFMTrack[nbtracks];
         memset(new_disk->side_[side].tracks, 0, sizeof(IDisk::MFMTrack) * nbtracks);
         for (int tr = 0; tr < nbtracks; tr++)
         {
            new_disk->side_[side].tracks[tr].nb_revolutions = 1;
         }
      }

      // Track data header
      for (int i = 0; i < 166; i++)
      {
         tracks_header_[i].offset = *((unsigned int*)(&header[0x10 + i * 4]));

         if (tracks_header_[i].offset != 0)
         {
            const unsigned char* track_buffer = &header[tracks_header_[i].offset];
            // Check the TRK
            if (memcmp(&track_buffer[0], "TRK", 3) != 0)
            {
               // Error : No valid SCP file
               return -3;
            }

            // Track number
            int side = (new_disk->nb_sides_ == 1) ? 0 : (track_buffer[0x03] & 0x1);
            unsigned int track = (new_disk->nb_sides_ == 1) ? track_buffer[0x03] : (track_buffer[0x03] >> 1);

            if (track >= new_disk->side_[side].nb_tracks)
            {
               // TODO : Do Something here !
               int dbg = 1;
               return -1;
            }

            // Revolutions
            new_disk->side_[side].tracks[track].nb_revolutions = numRevolution;
            new_disk->side_[side].tracks[track].revolution = new IDisk::Revolution[numRevolution];

            for (int revolution = 0; revolution < numRevolution; revolution++)
            {
               //
               int duration = *((unsigned int*)(&track_buffer[0x04 + revolution * 12]));
               int length = *((unsigned int*)(&track_buffer[0x08 + revolution * 12]));
               int offset = *((unsigned int*)(&track_buffer[0x0C + revolution * 12]));

               //timeElapsed / ick * 1000;
               rpm_correction_ = (duration * 25 / 1000000) / 200.0;

               // Read the whole bitcells
               const unsigned char* cellbuffer = &track_buffer[offset];

               // Comute size in term of bits
               new_disk->side_[side].tracks[track].revolution[revolution].size = ComputeTrack(
                  NULL, cellbuffer, length, duration);

               // Fill the bitfield
               new_disk->side_[side].tracks[track].revolution[revolution].bitfield = new unsigned char[new_disk->side_[
                  side].tracks[track].revolution[revolution].size];
               new_disk->side_[side].tracks[track].revolution[revolution].size = ComputeTrack(
                  new_disk->side_[side].tracks[track].revolution[revolution].bitfield, cellbuffer, length, duration);
            }

            //AdjustLength ( m_Disk[side].Tracks[track].Revolution, numRevolution);

            if (track == 0)
            {
               //DumpTrack (0, 0, 0);
            }
         }
      }
      // Adjust missing tracks :
      for (int side = 0; side < new_disk->nb_sides_; side++)
      {
         for (int track = 0; track < 43 && track < new_disk->side_[side].nb_tracks; track++)
         {
            if (new_disk->side_[side].tracks[track].revolution == NULL)
            {
               // Fill this revolution with random datas
               new_disk->side_[side].tracks[track].nb_revolutions = 1;
               new_disk->side_[side].tracks[track].revolution = new IDisk::Revolution[1];
               new_disk->side_[side].tracks[track].revolution[0].bitfield = new unsigned char[6250 * 16];
               new_disk->side_[side].tracks[track].revolution[0].size = 6250 * 16;
               memset(new_disk->side_[side].tracks[track].revolution[0].bitfield, 0, 6250 * 16);
            }
         }
      }
      created_disk = new_disk;
   }
   else
   {
      // Erreur : Not a DSK file !
      return FILE_ERROR;
   }

   created_disk->CreateTrackFromMultiRevolutions();

   return OK;
}